

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O3

void updateLtlStoreOfNtk(Abc_Ntk_t *pNtk,Vec_Ptr_t *tempLtlStore)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  long lVar6;
  
  if (tempLtlStore != (Vec_Ptr_t *)0x0) {
    if (0 < tempLtlStore->nSize) {
      lVar6 = 0;
      do {
        pvVar3 = tempLtlStore->pArray[lVar6];
        pVVar4 = pNtk->vLtlProperties;
        uVar1 = pVVar4->nSize;
        if (uVar1 == pVVar4->nCap) {
          if ((int)uVar1 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = 0x10;
          }
          else {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = uVar1 * 2;
          }
        }
        else {
          ppvVar5 = pVVar4->pArray;
        }
        iVar2 = pVVar4->nSize;
        pVVar4->nSize = iVar2 + 1;
        ppvVar5[iVar2] = pvVar3;
        lVar6 = lVar6 + 1;
      } while (lVar6 < tempLtlStore->nSize);
    }
    return;
  }
  __assert_fail("tempLtlStore != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioUtil.c"
                ,0xde,"void updateLtlStoreOfNtk(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

void updateLtlStoreOfNtk( Abc_Ntk_t *pNtk, Vec_Ptr_t *tempLtlStore )
{
	int i;
	char *pFormula;

	assert( tempLtlStore != NULL );
	Vec_PtrForEachEntry( char *, tempLtlStore, pFormula, i )
		Vec_PtrPush( pNtk->vLtlProperties, pFormula );
}